

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

void do_osshock(obj *obj)

{
  int iVar1;
  boolean bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  obj_zapped = 1;
  if (poly_zapped < 0) {
    for (lVar6 = (long)obj->quan; lVar6 != 0; lVar6 = lVar6 + -1) {
      lVar4 = (long)u.uluck;
      lVar5 = (long)u.moreluck;
      uVar3 = mt_random();
      if (SUB168(ZEXT416(uVar3) % SEXT816(lVar4 + lVar5 + 0x2d),0) == 0) {
        poly_zapped = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
        break;
      }
    }
  }
  iVar1 = obj->quan;
  if (1 < (long)iVar1) {
    if (iVar1 < 0x8000) {
      uVar3 = mt_random();
      uVar3 = SUB164(ZEXT416(uVar3) % SEXT816((long)iVar1 + -1),0);
    }
    else {
      uVar3 = mt_random();
      uVar3 = uVar3 % 30000;
    }
    obj = splitobj(obj,(ulong)(uVar3 + 1));
  }
  bVar2 = costly_spot(obj->ox,obj->oy);
  if (bVar2 != '\0') {
    if (u.ushops[0] == '\0') {
      stolen_value(obj,obj->ox,obj->oy,'\0','\0');
    }
    else {
      addtobill(obj,'\0','\0','\0');
    }
  }
  delobj(obj);
  return;
}

Assistant:

void do_osshock(struct obj *obj)
{
	long i;

	obj_zapped = TRUE;

	if (poly_zapped < 0) {
	    /* some may metamorphosize */
	    for (i = obj->quan; i; i--)
		if (! rn2(Luck + 45)) {
		    poly_zapped = objects[obj->otyp].oc_material;
		    break;
		}
	}

	/* if quan > 1 then some will survive intact */
	if (obj->quan > 1L) {
	    if (obj->quan > LARGEST_INT)
		obj = splitobj(obj, (long)rnd(30000));
	    else
		obj = splitobj(obj, (long)rnd((int)obj->quan - 1));
	}

	/* appropriately add damage to bill */
	if (costly_spot(obj->ox, obj->oy)) {
		if (*u.ushops)
			addtobill(obj, FALSE, FALSE, FALSE);
		else
			stolen_value(obj,
					   obj->ox, obj->oy, FALSE, FALSE);
	}

	/* zap the object */
	delobj(obj);
}